

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint *puVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 in_register_0000008c;
  uint *puVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  SmallVector<int,_32UL> row;
  int local_fc;
  size_t local_f8;
  int local_ec;
  int *local_e8;
  size_t local_e0;
  undefined8 local_d8;
  uint *local_d0;
  SmallVector<int,_32UL> local_c8;
  
  local_d8 = CONCAT44(in_register_0000008c,maxDistance);
  sVar9 = right._M_len;
  local_e0 = left._M_len;
  SmallVector<int,_32UL>::SmallVector(&local_c8,sVar9);
  local_fc = 0;
  local_f8 = sVar9;
  if (-1 < (int)right._M_len) {
    do {
      SmallVectorBase<int>::emplace_back<int_const&>(&local_c8.super_SmallVectorBase<int>,&local_fc)
      ;
      iVar5 = local_fc + 1;
      bVar2 = local_fc < (int)local_f8;
      local_fc = iVar5;
    } while (bVar2);
  }
  if (local_e0 != 0) {
    uVar4 = 2;
    if (2 < local_f8 + 1) {
      uVar4 = local_f8 + 1;
    }
    iVar3 = (int)local_d8;
    iVar5 = iVar3 + 1;
    local_d0 = (uint *)(local_c8.super_SmallVectorBase<int>.data_ + 1);
    uVar7 = 1;
    local_e8 = local_c8.super_SmallVectorBase<int>.data_;
    do {
      iVar6 = (int)uVar7;
      *local_c8.super_SmallVectorBase<int>.data_ = iVar6;
      if (local_f8 != 0) {
        lVar14 = 0;
        uVar16 = uVar7 & 0xffffffff;
        uVar15 = uVar7 - 1 & 0xffffffff;
        uVar12 = uVar7 & 0xffffffff;
        puVar13 = local_d0;
        do {
          uVar10 = (uint)uVar15;
          uVar1 = *puVar13;
          uVar15 = (ulong)uVar1;
          if (allowReplacements) {
            uVar11 = uVar10 + (left._M_str[uVar7 - 1] != right._M_str[lVar14]);
            puVar8 = puVar13 + -1;
            if ((int)uVar1 < (int)uVar16) {
              puVar8 = puVar13;
            }
            uVar10 = *puVar8 + 1;
            if ((int)uVar11 <= (int)(*puVar8 + 1)) {
              uVar10 = uVar11;
            }
          }
          else if (left._M_str[uVar7 - 1] != right._M_str[lVar14]) {
            puVar8 = puVar13 + -1;
            if ((int)uVar1 < (int)uVar16) {
              puVar8 = puVar13;
            }
            uVar10 = *puVar8 + 1;
          }
          *puVar13 = uVar10;
          if ((int)uVar10 < (int)uVar12) {
            uVar12 = (ulong)uVar10;
          }
          iVar6 = (int)uVar12;
          lVar14 = lVar14 + 1;
          puVar13 = puVar13 + 1;
          uVar16 = (ulong)uVar10;
        } while (uVar4 - 1 != lVar14);
      }
      local_ec = iVar5;
      if ((iVar3 != 0) && (iVar3 < iVar6)) goto LAB_001d20df;
      uVar7 = uVar7 + 1;
    } while (uVar7 <= local_e0);
  }
  iVar5 = local_c8.super_SmallVectorBase<int>.data_[local_f8];
LAB_001d20df:
  if (local_c8.super_SmallVectorBase<int>.data_ !=
      (pointer)local_c8.super_SmallVectorBase<int>.firstElement) {
    operator_delete(local_c8.super_SmallVectorBase<int>.data_);
  }
  return iVar5;
}

Assistant:

int editDistance(std::string_view left, std::string_view right, bool allowReplacements,
                 int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}